

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::interpreter::impl::auto_stack_update::~auto_stack_update(auto_stack_update *this)

{
  pointer psVar1;
  bool bVar2;
  
  psVar1 = (this->parent_->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->parent_->stack_trace_).
      super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
      super__Vector_impl_data._M_start != psVar1) {
    bVar2 = source_extend::operator==(psVar1 + -1,&this->pos_);
    if (bVar2) {
      std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::pop_back
                (&this->parent_->stack_trace_);
      source_extend::operator=(&this->parent_->current_extend_,&this->old_extend_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(this->old_extend_).file.
                  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
  }
  __assert_fail("!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x4ee,"mjs::interpreter::impl::auto_stack_update::~auto_stack_update()");
}

Assistant:

~auto_stack_update() {
            assert(!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_);
            parent_.stack_trace_.pop_back();
            parent_.current_extend_ = old_extend_;
        }